

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.cpp
# Opt level: O3

bool __thiscall CaseInsensitiveLess::operator()(CaseInsensitiveLess *this,string *s1,string *s2)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  byte extraout_var;
  size_type sVar4;
  
  sVar1 = s1->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (s1->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar4]);
      pcVar2[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  sVar1 = s2->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (s2->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar4]);
      pcVar2[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  std::__cxx11::string::compare((string *)s1);
  return (bool)(extraout_var >> 7);
}

Assistant:

bool operator() (std::string s1, std::string s2) const {
        std::for_each(std::begin(s1), std::end(s1), [](char& c){
            c = std::tolower(c);
        });
        std::for_each(std::begin(s2), std::end(s2), [](char& c){
            c = std::tolower(c);
        });
        return s1 < s2;
    }